

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O3

SeedType cppqc::detail::resolveSeed(SeedType originalSeed)

{
  int iVar1;
  char *__nptr;
  char *__s;
  size_t sVar2;
  int *piVar3;
  ulong uVar4;
  ostream *poVar5;
  invalid_argument *this;
  undefined1 auVar6 [12];
  ostringstream err;
  char *local_1c8 [4];
  char *local_1a8 [2];
  char local_198 [360];
  
  uVar4 = (ulong)originalSeed;
  if (originalSeed == 0xffffffff) {
    __s = getenv("CPPQUICKCHECK_SEED");
    if (__s != (char *)0x0) {
      local_1a8[0] = local_198;
      sVar2 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar2);
      __nptr = local_1a8[0];
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      *piVar3 = 0;
      uVar4 = strtol(__nptr,local_1c8,10);
      if (local_1c8[0] == __nptr) {
        std::__throw_invalid_argument("stoi");
      }
      else if (((long)(int)uVar4 == uVar4) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = iVar1;
        }
        if (local_1a8[0] != local_198) {
          operator_delete(local_1a8[0]);
        }
        goto LAB_00109d2c;
      }
      auVar6 = std::__throw_out_of_range("stoi");
      if (auVar6._8_4_ == 1) {
        __cxa_begin_catch(auVar6._0_8_);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to parse seed in environment variable ",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"CPPQUICKCHECK_SEED",0x12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": Got <",7);
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,">, but expected an integer between ",0x23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0 and ",6);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,". To use a random seed instead, unset the environment variable.",0x3f);
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this,(string *)local_1c8);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      _Unwind_Resume(auVar6._0_8_);
    }
    uVar4 = time((time_t *)0x0);
  }
LAB_00109d2c:
  return (SeedType)uVar4;
}

Assistant:

inline SeedType resolveSeed(SeedType originalSeed = USE_DEFAULT_SEED) {
  if (originalSeed == USE_DEFAULT_SEED) {
    const char* seed_from_env = std::getenv(CPPQUICKCHECK_SEED_ENV);
    if (seed_from_env != nullptr) {
      try {
        return static_cast<uint32_t>(std::stoi(seed_from_env));
      } catch (std::invalid_argument&) {
        std::ostringstream err;
        err << "Failed to parse seed in environment variable "
            << CPPQUICKCHECK_SEED_ENV << ": Got <" << seed_from_env
            << ">, but expected an integer between "
            << "0 and " << (USE_DEFAULT_SEED - 1)
            << ". To use a random seed instead, "
               "unset the environment variable.";
        throw std::invalid_argument{err.str()};
      }
    } else {
      return static_cast<SeedType>(std::time(0));
    }
  } else {
    return originalSeed;
  }
}